

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O1

void FAudio_OPERATIONSET_QueueSetEffectParameters
               (FAudioVoice *voice,uint32_t EffectIndex,void *pParameters,
               uint32_t ParametersByteSize,uint32_t OperationSet)

{
  FAudio_OPERATIONSET_Operation *pFVar1;
  FAudio_OPERATIONSET_Operation *pFVar2;
  FAudio_OPERATIONSET_Operation **ppFVar3;
  void *pvVar4;
  FAudio_OPERATIONSET_Operation *pFVar5;
  
  FAudio_PlatformLockMutex(voice->audio->operationLock);
  pFVar2 = (FAudio_OPERATIONSET_Operation *)(*voice->audio->pMalloc)(0x30);
  pFVar2->Type = FAUDIOOP_SETEFFECTPARAMETERS;
  pFVar2->Voice = voice;
  pFVar2->OperationSet = OperationSet;
  pFVar2->next = (FAudio_OPERATIONSET_Operation *)0x0;
  pFVar1 = voice->audio->queuedOperations;
  if (pFVar1 == (FAudio_OPERATIONSET_Operation *)0x0) {
    ppFVar3 = &voice->audio->queuedOperations;
  }
  else {
    do {
      pFVar5 = pFVar1;
      pFVar1 = pFVar5->next;
    } while (pFVar1 != (FAudio_OPERATIONSET_Operation *)0x0);
    ppFVar3 = &pFVar5->next;
  }
  *ppFVar3 = pFVar2;
  (pFVar2->Data).SetEffectParameters.EffectIndex = EffectIndex;
  pvVar4 = (*voice->audio->pMalloc)((size_t)ParametersByteSize);
  (pFVar2->Data).SetEffectParameters.pParameters = pvVar4;
  SDL_memcpy(pvVar4,pParameters,ParametersByteSize);
  (pFVar2->Data).SetEffectParameters.ParametersByteSize = ParametersByteSize;
  FAudio_PlatformUnlockMutex(voice->audio->operationLock);
  return;
}

Assistant:

void FAudio_OPERATIONSET_QueueSetEffectParameters(
	FAudioVoice *voice,
	uint32_t EffectIndex,
	const void *pParameters,
	uint32_t ParametersByteSize,
	uint32_t OperationSet
) {
	FAudio_OPERATIONSET_Operation *op;

	FAudio_PlatformLockMutex(voice->audio->operationLock);
	LOG_MUTEX_LOCK(voice->audio, voice->audio->operationLock)

	op = QueueOperation(
		voice,
		FAUDIOOP_SETEFFECTPARAMETERS,
		OperationSet
	);

	op->Data.SetEffectParameters.EffectIndex = EffectIndex;
	op->Data.SetEffectParameters.pParameters = voice->audio->pMalloc(
		ParametersByteSize
	);
	FAudio_memcpy(
		op->Data.SetEffectParameters.pParameters,
		pParameters,
		ParametersByteSize
	);
	op->Data.SetEffectParameters.ParametersByteSize = ParametersByteSize;

	FAudio_PlatformUnlockMutex(voice->audio->operationLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->audio->operationLock)
}